

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<float>_>::SolveSOR
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  _ComplexT _Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float __x;
  float fVar14;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar15;
  undefined4 extraout_XMM0_Da_01;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined4 local_b8;
  undefined4 local_58;
  long lVar7;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  fVar18 = (float)*tol;
  fVar13 = fVar18 * 2.0;
  if ((NAN(fVar13)) && (NAN(fVar18 * 0.0))) {
    fVar13 = (float)__mulsc3(0x40000000,0,fVar18,0);
  }
  if (residual == (TPZFMatrix<std::complex<float>_> *)0x0) {
    fVar13 = fVar13 + 1.0;
  }
  else {
    Dot<std::complex<float>>(residual,residual);
    if (__x < 0.0) {
      fVar13 = sqrtf(__x);
    }
    else {
      fVar13 = SQRT(__x);
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar7 = CONCAT44(extraout_var,iVar6);
  lVar11 = 0;
  lVar8 = lVar7 + -1;
  lVar4 = -1;
  if (direction != -1) {
    lVar8 = lVar11;
    lVar4 = lVar7;
  }
  if (0 < *numiterations) {
    lVar2 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    fVar18 = (float)overrelax;
    lVar11 = 0;
    do {
      fVar14 = cabsf(fVar13);
      if ((double)ABS(fVar14) <= ABS(*tol)) break;
      if (lVar2 < 1) {
        fVar13 = 0.0;
      }
      else {
        fVar13 = 0.0;
        lVar9 = 0;
        lVar10 = 0;
        lVar5 = lVar8;
        do {
          for (; lVar5 != lVar4; lVar5 = lVar5 + (ulong)(direction != -1) * 2 + -1) {
            (*(F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(F,lVar5,lVar10);
            fVar14 = extraout_XMM0_Da;
            fVar21 = extraout_XMM0_Db;
            if (0 < lVar7) {
              lVar12 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar5,lVar12);
                lVar3 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
                if ((lVar3 <= lVar12) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar10)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                _Var1 = *(_ComplexT *)((long)&result->fElem[lVar12]._M_value + lVar3 * lVar9);
                fVar19 = (float)_Var1;
                fVar20 = (float)(_Var1 >> 0x20);
                fVar15 = extraout_XMM0_Da_00 * fVar19 - extraout_XMM0_Db_00 * fVar20;
                fVar17 = extraout_XMM0_Da_00 * fVar20 + extraout_XMM0_Db_00 * fVar19;
                uVar16 = CONCAT44(fVar17,fVar15);
                if ((NAN(fVar15)) && (uVar16 = CONCAT44(fVar17,fVar15), NAN(fVar17))) {
                  uVar16 = __mulsc3(extraout_XMM0_Da_00,extraout_XMM0_Db_00,fVar19,fVar20);
                }
                fVar14 = fVar14 - (float)uVar16;
                fVar21 = fVar21 - (float)((ulong)uVar16 >> 0x20);
                lVar12 = lVar12 + 1;
              } while (lVar7 != lVar12);
            }
            fVar15 = fVar14 * fVar14 - fVar21 * fVar21;
            if ((NAN(fVar15)) && (NAN(fVar21 * fVar14 + fVar21 * fVar14))) {
              fVar15 = (float)__mulsc3(fVar14,fVar21);
            }
            fVar17 = fVar14 * fVar18 - fVar21 * 0.0;
            fVar21 = fVar14 * 0.0 + fVar21 * fVar18;
            uVar16 = CONCAT44(fVar21,fVar17);
            if ((NAN(fVar17)) && (uVar16 = CONCAT44(fVar21,fVar17), NAN(fVar21))) {
              uVar16 = __mulsc3(fVar18,0,fVar14);
            }
            local_58 = (undefined4)((ulong)uVar16 >> 0x20);
            local_b8 = (undefined4)uVar16;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5)
            ;
            uVar16 = __divsc3(local_b8,local_58,extraout_XMM0_Da_01,extraout_XMM0_Db_01);
            if (((lVar5 < 0) ||
                (lVar12 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
                lVar12 <= lVar5)) ||
               ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar10))
            {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            fVar13 = fVar13 + fVar15;
            lVar12 = lVar12 * lVar10;
            _Var1 = result->fElem[lVar12 + lVar5]._M_value;
            result->fElem[lVar12 + lVar5]._M_value =
                 CONCAT44((float)((ulong)uVar16 >> 0x20) + (float)(_Var1 >> 0x20),
                          (float)uVar16 + (float)_Var1);
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 8;
          lVar5 = lVar8;
        } while (lVar10 != lVar2);
      }
      fVar13 = csqrtf(fVar13);
      lVar11 = lVar11 + 1;
    } while (lVar11 < *numiterations);
  }
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar11;
  fVar13 = cabsf(fVar13);
  *tol = (double)ABS(fVar13);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}